

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>,_bool>
* __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
::insert_unique<std::piecewise_construct_t_const&,std::tuple<Vector3<double>const&>,std::tuple<>>
          (pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>,_bool>
           *__return_storage_ptr__,
          btree<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
          *this,key_type *key,piecewise_construct_t *args,tuple<const_Vector3<double>_&> *args_1,
          tuple<> *args_2)

{
  bool bVar1;
  node_type *pnVar2;
  key_type *b;
  undefined8 extraout_RDX;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>
  iter;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>
  iter_00;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>
  bVar3;
  iterator iVar4;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>,_int>
  res;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>
  local_40;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar2 = btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar2;
    *(node_type **)this = pnVar2;
  }
  else {
    pnVar2 = *(node_type **)this;
  }
  bVar3._8_8_ = 0;
  bVar3.node = pnVar2;
  internal_locate_plain_compare<Vector3<double>,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>,std::pair<Vector3<double>const,int>&,std::pair<Vector3<double>const,int>*>>
            (&res,this,key,bVar3);
  if (res.second == 0) {
    iter_00.node = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                    *)(ulong)(uint)res.first.position;
    iter_00._8_8_ = extraout_RDX;
    bVar3 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>,std::pair<Vector3<double>const,int>&,std::pair<Vector3<double>const,int>*>>
                      ((btree<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                        *)res.first.node,iter_00);
    local_40.node = bVar3.node;
    local_40.position = bVar3.position;
    if (local_40.node !=
        (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
         *)0x0) {
      b = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>,_std::pair<const_Vector3<double>,_int>_&,_std::pair<const_Vector3<double>,_int>_*>
          ::key(&local_40);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator<
                        ((BasicVector<Vector3,_double,_3UL> *)key,b);
      if (!bVar1) {
        (__return_storage_ptr__->first).node = local_40.node;
        *(ulong *)&(__return_storage_ptr__->first).position =
             CONCAT44(local_40._12_4_,local_40.position);
        goto LAB_00211881;
      }
    }
  }
  else if (res.second == 0x40000000) {
    iter.node = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                 *)(ulong)(uint)res.first.position;
    iter._8_8_ = extraout_RDX;
    bVar3 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>,std::pair<Vector3<double>const,int>&,std::pair<Vector3<double>const,int>*>>
                      ((btree<gtl::internal_btree::map_params<Vector3<double>,int,std::less<Vector3<double>>,std::allocator<std::pair<Vector3<double>const,int>>,256,false>>
                        *)res.first.node,iter);
    (__return_storage_ptr__->first).node = bVar3.node;
    (__return_storage_ptr__->first).position = bVar3.position;
LAB_00211881:
    __return_storage_ptr__->second = false;
    return __return_storage_ptr__;
  }
  iVar4.position = res.first.position;
  iVar4.node = res.first.node;
  iVar4._12_4_ = 0;
  iVar4 = internal_emplace<std::piecewise_construct_t_const&,std::tuple<Vector3<double>const&>,std::tuple<>>
                    (this,iVar4,args,args_1,args_2);
  (__return_storage_ptr__->first).node = iVar4.node;
  (__return_storage_ptr__->first).position = iVar4.position;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  std::pair<iterator, int> res = internal_locate(key, iterator(root(), 0));
  iterator &iter = res.first;
  if (res.second == kExactMatch) {
    // The key already exists in the tree, do nothing.
    return std::make_pair(internal_last(iter), false);
  } else if (!res.second) {
    iterator last = internal_last(iter);
    if (last.node && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return std::make_pair(last, false);
    }
  }

  return std::make_pair(internal_emplace(iter, std::forward<Args>(args)...),
                        true);
}